

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O0

Own<capnp::_::BuilderArena::MultiSegmentState> * __thiscall
kj::Own<capnp::_::BuilderArena::MultiSegmentState>::operator=
          (Own<capnp::_::BuilderArena::MultiSegmentState> *this,
          Own<capnp::_::BuilderArena::MultiSegmentState> *other)

{
  Disposer *this_00;
  MultiSegmentState *object;
  MultiSegmentState *ptrCopy;
  Disposer *disposerCopy;
  Own<capnp::_::BuilderArena::MultiSegmentState> *other_local;
  Own<capnp::_::BuilderArena::MultiSegmentState> *this_local;
  
  this_00 = this->disposer;
  object = this->ptr;
  this->disposer = other->disposer;
  this->ptr = other->ptr;
  other->ptr = (MultiSegmentState *)0x0;
  if (object != (MultiSegmentState *)0x0) {
    Disposer::dispose<capnp::_::BuilderArena::MultiSegmentState>(this_00,object);
  }
  return this;
}

Assistant:

inline Own& operator=(Own&& other) {
    // Move-assingnment operator.

    // Careful, this might own `other`.  Therefore we have to transfer the pointers first, then
    // dispose.
    const Disposer* disposerCopy = disposer;
    T* ptrCopy = ptr;
    disposer = other.disposer;
    ptr = other.ptr;
    other.ptr = nullptr;
    if (ptrCopy != nullptr) {
      disposerCopy->dispose(const_cast<RemoveConst<T>*>(ptrCopy));
    }
    return *this;
  }